

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,string *_name,string *_className,string *_description,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_tags,SourceLineInfo *_lineInfo)

{
  SourceLineInfo *_lineInfo_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *_tags_local;
  string *_description_local;
  string *_className_local;
  string *_name_local;
  TestCaseInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::__cxx11::string::string((string *)&this->className,(string *)_className);
  std::__cxx11::string::string((string *)&this->description,(string *)_description);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->tags);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->lcaseTags);
  std::__cxx11::string::string((string *)&this->tagsAsString);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,_lineInfo);
  this->properties = None;
  setTags(this,_tags);
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo(std::string const& _name,
		std::string const& _className,
		std::string const& _description,
		std::set<std::string> const& _tags,
		SourceLineInfo const& _lineInfo)
		: name(_name),
		className(_className),
		description(_description),
		lineInfo(_lineInfo),
		properties(None)
	{
		setTags(*this, _tags);
	}